

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_cell_quality_tec
          (REF_NODE ref_node,REF_CELL ref_cell,REF_LONG ncell_expected,REF_GLOB *l2c,
          REF_DBL min_quality,FILE *file)

{
  REF_MPI ref_mpi;
  REF_GLOB *pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  undefined8 uVar7;
  REF_LONG ref_private_status_reis_ai;
  int iVar8;
  REF_INT source;
  REF_LONG ref_private_status_reis_bi;
  long lVar9;
  ulong uVar10;
  REF_INT ncell;
  REF_INT part;
  REF_DBL quality;
  REF_INT nodes [27];
  int local_f4;
  REF_CELL local_f0;
  int local_e4;
  REF_MPI local_e0;
  REF_NODE local_d8;
  void *local_d0;
  long local_c8;
  double local_c0;
  REF_GLOB *local_b8;
  REF_LONG local_b0;
  REF_INT local_a8 [30];
  
  local_e0 = ref_node->ref_mpi;
  uVar4 = ref_cell->node_per;
  uVar10 = (ulong)uVar4;
  local_f0 = ref_cell;
  local_d8 = ref_node;
  local_d0 = (void *)min_quality;
  local_b8 = l2c;
  local_b0 = ncell_expected;
  if ((local_e0->id == 0) && (0 < ref_cell->max)) {
    iVar8 = 0;
    local_c8 = 0;
    do {
      RVar2 = ref_cell_nodes(ref_cell,iVar8,local_a8);
      if (RVar2 == 0) {
        uVar3 = ref_cell_part(ref_cell,local_d8,iVar8,&local_e4);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x2f9,"ref_gather_cell_quality_tec",(ulong)uVar3,"part");
          return uVar3;
        }
        ref_cell = local_f0;
        if (local_e0->id == local_e4) {
          uVar3 = ref_node_tet_quality(local_d8,local_a8,&local_c0);
          pRVar1 = local_b8;
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x2fb,"ref_gather_cell_quality_tec",(ulong)uVar3,"qual");
            return uVar3;
          }
          ref_cell = local_f0;
          if (local_c0 < (double)local_d0) {
            if (0 < (int)uVar4) {
              uVar6 = 0;
              do {
                fprintf((FILE *)file," %ld",pRVar1[local_a8[uVar6]] + 1);
                uVar6 = uVar6 + 1;
              } while (uVar10 != uVar6);
            }
            local_c8 = local_c8 + 1;
            fputc(10,(FILE *)file);
            ref_cell = local_f0;
          }
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < ref_cell->max);
  }
  else {
    local_c8 = 0;
  }
  if (local_e0->id == 0) {
    if (1 < local_e0->n) {
      local_d8 = (REF_NODE)(uVar10 * 8);
      source = 1;
      do {
        ref_mpi = local_e0;
        uVar3 = ref_mpi_gather_recv(local_e0,&local_f4,1,1,source);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x30c,"ref_gather_cell_quality_tec",(ulong)uVar3,"recv ncell");
          return uVar3;
        }
        local_f0 = (REF_CELL)CONCAT44(local_f0._4_4_,source);
        uVar3 = local_f4 * uVar4;
        if ((int)uVar3 < 0) {
          uVar7 = 0x30d;
          goto LAB_0012c15f;
        }
        pvVar5 = malloc((ulong)uVar3 << 3);
        if (pvVar5 == (void *)0x0) {
          uVar7 = 0x30d;
          goto LAB_0012c191;
        }
        uVar3 = ref_mpi_gather_recv(ref_mpi,pvVar5,uVar3,2,(REF_INT)local_f0);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x310,"ref_gather_cell_quality_tec",(ulong)uVar3,"recv c2n");
          return uVar3;
        }
        local_d0 = pvVar5;
        if (0 < local_f4) {
          lVar9 = 0;
          do {
            if (0 < (int)uVar4) {
              uVar6 = 0;
              do {
                *(long *)((long)pvVar5 + uVar6 * 8) = *(long *)((long)pvVar5 + uVar6 * 8) + 1;
                fprintf((FILE *)file," %ld");
                uVar6 = uVar6 + 1;
              } while (uVar10 != uVar6);
            }
            fputc(10,(FILE *)file);
            lVar9 = lVar9 + 1;
            pvVar5 = (void *)((long)pvVar5 + (long)local_d8);
          } while (lVar9 < local_f4);
        }
        local_c8 = local_c8 + 1;
        free(local_d0);
        source = (REF_INT)local_f0 + 1;
      } while (source < local_e0->n);
    }
  }
  else {
    local_f4 = 0;
    if (0 < ref_cell->max) {
      iVar8 = 0;
      do {
        RVar2 = ref_cell_nodes(ref_cell,iVar8,local_a8);
        if (RVar2 == 0) {
          uVar3 = ref_cell_part(ref_cell,local_d8,iVar8,&local_e4);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x31e,"ref_gather_cell_quality_tec",(ulong)uVar3,"part");
            return uVar3;
          }
          ref_cell = local_f0;
          if (local_e0->id == local_e4) {
            uVar3 = ref_node_tet_quality(local_d8,local_a8,&local_c0);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,800,"ref_gather_cell_quality_tec",(ulong)uVar3,"qual");
              return uVar3;
            }
            ref_cell = local_f0;
            if (local_c0 < (double)local_d0) {
              local_f4 = local_f4 + 1;
            }
          }
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < ref_cell->max);
    }
    uVar3 = ref_mpi_gather_send(local_e0,&local_f4,1,1);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x324,"ref_gather_cell_quality_tec",(ulong)uVar3,"send ncell");
      return uVar3;
    }
    if ((int)(local_f4 * uVar4) < 0) {
      uVar7 = 0x325;
LAB_0012c15f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar7,"ref_gather_cell_quality_tec","malloc c2n of REF_GLOB negative");
      return 1;
    }
    pvVar5 = malloc((ulong)(local_f4 * uVar4) << 3);
    if (pvVar5 == (void *)0x0) {
      uVar7 = 0x325;
LAB_0012c191:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar7,"ref_gather_cell_quality_tec","malloc c2n of REF_GLOB NULL");
      return 2;
    }
    local_f4 = 0;
    if (0 < ref_cell->max) {
      iVar8 = 0;
      do {
        RVar2 = ref_cell_nodes(ref_cell,iVar8,local_a8);
        if (RVar2 == 0) {
          uVar3 = ref_cell_part(ref_cell,local_d8,iVar8,&local_e4);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x328,"ref_gather_cell_quality_tec",(ulong)uVar3,"part");
            return uVar3;
          }
          ref_cell = local_f0;
          if (local_e0->id == local_e4) {
            uVar3 = ref_node_tet_quality(local_d8,local_a8,&local_c0);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x32a,"ref_gather_cell_quality_tec",(ulong)uVar3,"qual");
              return uVar3;
            }
            ref_cell = local_f0;
            if (local_c0 < (double)local_d0) {
              if (0 < (int)uVar4) {
                uVar6 = 0;
                do {
                  *(REF_GLOB *)((long)pvVar5 + uVar6 * 8 + (long)(int)uVar4 * (long)local_f4 * 8) =
                       local_b8[local_a8[uVar6]];
                  uVar6 = uVar6 + 1;
                } while (uVar10 != uVar6);
              }
              local_f4 = local_f4 + 1;
            }
          }
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < ref_cell->max);
    }
    uVar4 = ref_mpi_gather_send(local_e0,pvVar5,uVar4 * local_f4,2);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x333,"ref_gather_cell_quality_tec",(ulong)uVar4,"send c2n");
      return uVar4;
    }
    free(pvVar5);
  }
  if ((local_e0->id == 0) && (local_c8 != local_b0)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x338,
           "ref_gather_cell_quality_tec","cell count mismatch",local_b0,local_c8);
    RVar2 = 1;
  }
  else {
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_quality_tec(
    REF_NODE ref_node, REF_CELL ref_cell, REF_LONG ncell_expected,
    REF_GLOB *l2c, REF_DBL min_quality, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_INT ncell;
  REF_GLOB *c2n;
  REF_INT part, proc;
  REF_LONG ncell_actual;
  REF_DBL quality;

  ncell_actual = 0;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
        if (quality < min_quality) {
          for (node = 0; node < node_per; node++) {
            globals[node] = l2c[nodes[node]];
            globals[node]++;
            fprintf(file, " " REF_GLOB_FMT, globals[node]);
          }
          ncell_actual++;
          fprintf(file, "\n");
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");
      for (cell = 0; cell < ncell; cell++) {
        for (node = 0; node < node_per; node++) {
          c2n[node + node_per * cell]++;
          fprintf(file, " " REF_GLOB_FMT, c2n[node + node_per * cell]);
        }
        fprintf(file, "\n");
      }
      ncell_actual++;
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
        if (quality < min_quality) ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
        if (quality < min_quality) {
          for (node = 0; node < node_per; node++)
            c2n[node + node_per * ncell] = l2c[nodes[node]];
          ncell++;
        }
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");
    ref_free(c2n);
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}